

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O2

bool __thiscall
vkt::texture::SampleVerifier::verifySampleMipmapLevel
          (SampleVerifier *this,SampleArguments *args,Vec4 *result,Vec4 *coord,Vec2 *lodBounds,
          int level,ostream *report)

{
  Vec3 *unnormalizedCoordMin_00;
  Vec3 *unnormalizedCoordMax_00;
  VkSamplerMipmapMode mipmapFilter;
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  Vector<int,_3> *pVVar4;
  int iVar5;
  IVec3 *pIVar6;
  IVec3 *pIVar7;
  long lVar8;
  long lVar9;
  IVec3 gridCoordMin [2];
  IVec3 gridCoordMax [2];
  Vec3 unnormalizedCoordMax [2];
  Vec3 unnormalizedCoordMin [2];
  IVec3 gridCoord [2];
  FloatFormat coordFormat;
  
  mipmapFilter = this->m_samplerParams->mipmapFilter;
  iVar5 = this->m_imParams->levels;
  lVar9 = 0;
  do {
    tcu::Vector<float,_3>::Vector
              ((Vector<float,_3> *)((long)unnormalizedCoordMin[0].m_data + lVar9));
    lVar9 = lVar9 + 0xc;
  } while (lVar9 != 0x18);
  lVar9 = 0;
  do {
    tcu::Vector<float,_3>::Vector
              ((Vector<float,_3> *)((long)unnormalizedCoordMax[0].m_data + lVar9));
    lVar9 = lVar9 + 0xc;
  } while (lVar9 != 0x18);
  lVar9 = 0;
  do {
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)((long)gridCoordMin[0].m_data + lVar9));
    lVar9 = lVar9 + 0xc;
  } while (lVar9 != 0x18);
  lVar9 = 0;
  do {
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)((long)gridCoordMax[0].m_data + lVar9));
    lVar9 = lVar9 + 0xc;
  } while (lVar9 != 0x18);
  if (iVar5 + -1 == level) {
    mipmapFilter = VK_SAMPLER_MIPMAP_MODE_NEAREST;
  }
  tcu::FloatFormat::FloatFormat(&coordFormat,-0x20,0x20,0x10,true,MAYBE,MAYBE,MAYBE);
  util::calcUnnormalizedCoordRange
            (coord,&(this->m_levels->
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    )._M_impl.super__Vector_impl_data._M_start[level].m_size,&coordFormat,
             unnormalizedCoordMin,unnormalizedCoordMax);
  util::calcTexelGridCoordRange
            (unnormalizedCoordMin,unnormalizedCoordMax,this->m_coordBits,gridCoordMin,gridCoordMax);
  poVar3 = std::operator<<(report,"Level ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,level);
  poVar3 = std::operator<<(poVar3," computed unnormalized coordinate range: [");
  poVar3 = tcu::operator<<(poVar3,unnormalizedCoordMin);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = tcu::operator<<(poVar3,unnormalizedCoordMax);
  std::operator<<(poVar3,"]\n");
  poVar3 = std::operator<<(report,"Level ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,level);
  poVar3 = std::operator<<(poVar3," computed texel grid coordinate range: [");
  poVar3 = tcu::operator<<(poVar3,gridCoordMin);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = tcu::operator<<(poVar3,gridCoordMax);
  std::operator<<(poVar3,"]\n");
  if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR) {
    iVar5 = level + 1;
    unnormalizedCoordMin_00 = unnormalizedCoordMin + 1;
    unnormalizedCoordMax_00 = unnormalizedCoordMax + 1;
    util::calcUnnormalizedCoordRange
              (coord,&(this->m_levels->
                      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                      )._M_impl.super__Vector_impl_data._M_start[iVar5].m_size,&coordFormat,
               unnormalizedCoordMin_00,unnormalizedCoordMax_00);
    util::calcTexelGridCoordRange
              (unnormalizedCoordMin_00,unnormalizedCoordMax_00,this->m_coordBits,gridCoordMin + 1,
               gridCoordMax + 1);
    poVar3 = std::operator<<(report,"Level ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
    poVar3 = std::operator<<(poVar3," computed unnormalized coordinate range: [");
    poVar3 = tcu::operator<<(poVar3,unnormalizedCoordMin_00);
    poVar3 = std::operator<<(poVar3," - ");
    poVar3 = tcu::operator<<(poVar3,unnormalizedCoordMax_00);
    std::operator<<(poVar3,"]\n");
    poVar3 = std::operator<<(report,"Level ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
    poVar3 = std::operator<<(poVar3," computed texel grid coordinate range: [");
    poVar3 = tcu::operator<<(poVar3,gridCoordMin + 1);
    poVar3 = std::operator<<(poVar3," - ");
    poVar3 = tcu::operator<<(poVar3,gridCoordMax + 1);
    std::operator<<(poVar3,"]\n");
  }
  else {
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)gridCoord,0.0);
    unnormalizedCoordMax[1].m_data[2] = (float)gridCoord[0].m_data[2];
    unnormalizedCoordMax[1].m_data[0] = (float)gridCoord[0].m_data[0];
    unnormalizedCoordMax[1].m_data[1] = (float)gridCoord[0].m_data[1];
    unnormalizedCoordMin[1].m_data[0] = (float)gridCoord[0].m_data[0];
    unnormalizedCoordMin[1].m_data[1] = (float)gridCoord[0].m_data[1];
    unnormalizedCoordMin[1].m_data[2] = (float)gridCoord[0].m_data[2];
    tcu::Vector<int,_3>::Vector(gridCoord,0);
    gridCoordMax[1].m_data[2] = gridCoord[0].m_data[2];
    gridCoordMax[1].m_data[0] = gridCoord[0].m_data[0];
    gridCoordMax[1].m_data[1] = gridCoord[0].m_data[1];
    gridCoordMin[1].m_data[0] = gridCoord[0].m_data[0];
    gridCoordMin[1].m_data[1] = gridCoord[0].m_data[1];
    gridCoordMin[1].m_data[2] = gridCoord[0].m_data[2];
  }
  tcu::Vector<int,_3>::Vector(gridCoord,gridCoordMin);
  tcu::Vector<int,_3>::Vector(gridCoord + 1,gridCoordMin + 1);
  bVar1 = false;
  while (!bVar1) {
    bVar2 = verifySampleTexelGridCoords
                      (this,args,result,gridCoord,gridCoord + 1,lodBounds,level,mipmapFilter,report)
    ;
    if (bVar2) break;
    bVar1 = true;
    pIVar6 = gridCoordMax;
    pVVar4 = gridCoord;
    pIVar7 = gridCoordMin;
    for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        if (bVar1) {
          iVar5 = pVVar4->m_data[lVar8] + 1;
          pVVar4->m_data[lVar8] = iVar5;
          if (pIVar6->m_data[lVar8] < iVar5) {
            pVVar4->m_data[lVar8] = *(int *)((long)pIVar7 + lVar8 * 4);
          }
          else {
            bVar1 = false;
          }
        }
      }
      pIVar7 = (IVec3 *)((long)pIVar7 + 0xc);
      pIVar6 = pIVar6 + 1;
      pVVar4 = pVVar4 + 1;
    }
  }
  return (bool)~bVar1;
}

Assistant:

bool SampleVerifier::verifySampleMipmapLevel (const SampleArguments&	args,
											  const Vec4&				result,
											  const Vec4&				coord,
											  const Vec2&				lodBounds,
											  int						level,
											  std::ostream&				report) const
{
	DE_ASSERT(level < m_imParams.levels);

	VkSamplerMipmapMode mipmapFilter = m_samplerParams.mipmapFilter;

	if (level == m_imParams.levels - 1)
	{
		mipmapFilter = VK_SAMPLER_MIPMAP_MODE_NEAREST;
	}

	Vec3	unnormalizedCoordMin[2];
	Vec3	unnormalizedCoordMax[2];
	IVec3	gridCoordMin[2];
	IVec3	gridCoordMax[2];

	const FloatFormat coordFormat(-32, 32, 16, true);

	calcUnnormalizedCoordRange(coord,
							   m_levels[level].getSize(),
							   coordFormat,
							   unnormalizedCoordMin[0],
							   unnormalizedCoordMax[0]);

	calcTexelGridCoordRange(unnormalizedCoordMin[0],
							unnormalizedCoordMax[0],
							m_coordBits,
							gridCoordMin[0],
							gridCoordMax[0]);

	report << "Level " << level << " computed unnormalized coordinate range: [" << unnormalizedCoordMin[0] << ", " << unnormalizedCoordMax[0] << "]\n";
	report << "Level " << level << " computed texel grid coordinate range: [" << gridCoordMin[0] << ", " << gridCoordMax[0] << "]\n";

	if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
	{
		calcUnnormalizedCoordRange(coord,
								   m_levels[level+1].getSize(),
								   coordFormat,
								   unnormalizedCoordMin[1],
								   unnormalizedCoordMax[1]);

		calcTexelGridCoordRange(unnormalizedCoordMin[1],
								unnormalizedCoordMax[1],
								m_coordBits,
								gridCoordMin[1],
								gridCoordMax[1]);


		report << "Level " << level+1 << " computed unnormalized coordinate range: [" << unnormalizedCoordMin[1] << " - " << unnormalizedCoordMax[1] << "]\n";
		report << "Level " << level+1 << " computed texel grid coordinate range: [" << gridCoordMin[1] << " - " << gridCoordMax[1] << "]\n";
	}
	else
	{
		unnormalizedCoordMin[1] = unnormalizedCoordMax[1] = Vec3(0.0f);
		gridCoordMin[1] = gridCoordMax[1] = IVec3(0);
	}

	bool done = false;

	IVec3 gridCoord[2] = {gridCoordMin[0], gridCoordMin[1]};

    while (!done)
	{
		if (verifySampleTexelGridCoords(args, result, gridCoord[0], gridCoord[1], lodBounds, level, mipmapFilter, report))
			return true;

		// Get next grid coordinate to test at

		// Represents whether the increment at a position wraps and should "carry" to the next place
		bool carry = true;

		for (int levelNdx = 0; levelNdx < 2; ++levelNdx)
		{
			for (int compNdx = 0; compNdx < 3; ++compNdx)
			{
				if (carry)
				{
					deInt32& comp = gridCoord[levelNdx][compNdx];
				    ++comp;

					if (comp > gridCoordMax[levelNdx][compNdx])
					{
						comp = gridCoordMin[levelNdx][compNdx];
					}
					else
					{
						carry = false;
					}
				}
			}
		}

		done = carry;
	}

	return false;
}